

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionModelBullet::GetAABB
          (ChCollisionModelBullet *this,ChVector<double> *bbmin,ChVector<double> *bbmax)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionShape *pcVar2;
  cbtVector3 btmax;
  cbtVector3 btmin;
  float local_30;
  float local_2c;
  float local_28;
  float local_20;
  float local_1c;
  float local_18;
  
  pcVar1 = (this->bt_collision_object)._M_t.
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  pcVar2 = pcVar1->m_collisionShape;
  if (pcVar2 != (cbtCollisionShape *)0x0) {
    (*pcVar2->_vptr_cbtCollisionShape[2])(pcVar2,&pcVar1->m_worldTransform,&local_20,&local_30);
  }
  bbmin->m_data[0] = (double)local_20;
  bbmin->m_data[1] = (double)local_1c;
  bbmin->m_data[2] = (double)local_18;
  bbmax->m_data[0] = (double)local_30;
  bbmax->m_data[1] = (double)local_2c;
  bbmax->m_data[2] = (double)local_28;
  return;
}

Assistant:

void ChCollisionModelBullet::GetAABB(ChVector<>& bbmin, ChVector<>& bbmax) const {
    cbtVector3 btmin;
    cbtVector3 btmax;
    if (bt_collision_object->getCollisionShape())
        bt_collision_object->getCollisionShape()->getAabb(bt_collision_object->getWorldTransform(), btmin, btmax);
    bbmin.Set(btmin.x(), btmin.y(), btmin.z());
    bbmax.Set(btmax.x(), btmax.y(), btmax.z());
}